

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_modifiers_test.h
# Opt level: O3

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
EmplaceHint<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>_>
::TestBody(EmplaceHint<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>_>
           *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  mt19937_64 *__urng;
  long lVar3;
  char *pcVar4;
  T val;
  TypeParam m;
  result_type_conflict1 local_4d4;
  AssertHelper local_4d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_4c8;
  undefined1 local_4c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4b8 [2];
  anon_union_8_1_a8a14541_for_iterator_1 local_4a8;
  long alStack_4a0 [3];
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  local_488;
  
  local_488.sets_._M_elems[0].set_.ctrl_ = (ctrl_t *)0x7fffffff00000000;
  __urng = hash_internal::GetSharedRng();
  local_4d4 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_488,__urng,(param_type *)&local_488
                        );
  lVar3 = 0x40;
  do {
    *(undefined8 *)((long)local_4b8 + lVar3) = 0;
    *(undefined8 *)((long)local_4b8 + lVar3 + 8) = 0;
    *(undefined8 *)(local_4c0 + lVar3 + -8) = 0;
    *(undefined8 *)(local_4c0 + lVar3) = 0;
    *(undefined8 *)((long)alStack_4a0 + lVar3) = 0;
    *(long *)((long)alStack_4a0 + lVar3 + 8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)alStack_4a0 + lVar3 + 0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)((long)&local_488.sets_._M_elems[0].set_.ctrl_ + lVar3) = 0;
    lVar3 = lVar3 + 0x48;
  } while (lVar3 != 0x4c0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_4d4;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
  ::emplace_decomposable_with_hash<int,int&>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>::iterator,_bool>
              *)local_4c0,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
              *)&local_488,&local_4d4,
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0),&local_4d4);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_4c0,"val","*it",&local_4d4,local_4a8.slot_);
  if (local_4c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4c8);
    if (local_4b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_4b8[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
               ,0x61,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4d0,(Message *)&local_4c8);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    if (local_4c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_4c8._M_head_impl + 8))();
    }
  }
  if (local_4b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_4b8,local_4b8[0]);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)local_4d4;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
  ::emplace_decomposable_with_hash<int,int&>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>::iterator,_bool>
              *)local_4c0,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
              *)&local_488,&local_4d4,
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),&local_4d4);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_4c0,"val","*it",&local_4d4,local_4a8.slot_);
  if (local_4c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4c8);
    if (local_4b8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_4b8[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
               ,99,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4d0,(Message *)&local_4c8);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    if (local_4c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_4c8._M_head_impl + 8))();
    }
  }
  if (local_4b8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_4b8,local_4b8[0]);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::~parallel_hash_set(&local_488);
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, EmplaceHint) {
  using T = hash_internal::GeneratedType<TypeParam>;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  // TODO(alkis): We need a way to run emplace in a more meaningful way. Perhaps
  // with test traits/policy.
  auto it = m.emplace_hint(m.end(), val);
  EXPECT_EQ(val, *it);
  it = m.emplace_hint(it, val);
  EXPECT_EQ(val, *it);
}